

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<QHeaderViewPrivate::SectionItem>>
          (QDataStream *s,QList<QHeaderViewPrivate::SectionItem> *c)

{
  bool bVar1;
  const_iterator o;
  QList<QHeaderViewPrivate::SectionItem> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QHeaderViewPrivate::SectionItem> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *out;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out = in_RDI;
  QList<QHeaderViewPrivate::SectionItem>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x84ff91);
  if (bVar1) {
    local_10.i = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QHeaderViewPrivate::SectionItem>::begin
                         ((QList<QHeaderViewPrivate::SectionItem> *)out);
    o = QList<QHeaderViewPrivate::SectionItem>::end((QList<QHeaderViewPrivate::SectionItem> *)out);
    while (bVar1 = QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator!=(&local_10,o),
          bVar1) {
      QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator*(&local_10);
      ::operator<<(out,(SectionItem *)in_stack_ffffffffffffffa8);
      QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}